

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,long_double>
                 (float *x,size_t n_,MissingAction missing_action,float *w)

{
  size_t row;
  size_t sVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble local_80;
  longdouble local_70;
  longdouble local_64;
  long local_58;
  ushort uStack_50;
  longdouble local_44;
  
  lVar4 = (longdouble)0;
  lVar2 = lVar4;
  local_80 = lVar4;
  local_70 = lVar4;
  local_64 = lVar4;
  local_44 = lVar4;
  for (sVar1 = 0; n_ != sVar1; sVar1 = sVar1 + 1) {
    lVar6 = lVar2;
    if ((uint)ABS(x[sVar1]) < 0x7f800000) {
      lVar3 = (longdouble)w[sVar1];
      lVar6 = lVar4 + lVar3;
      lVar4 = (longdouble)x[sVar1] - local_64;
      lVar5 = lVar4 / lVar6;
      lVar4 = lVar4 * lVar2 * lVar5;
      local_64 = lVar3 * lVar5 + local_64;
      local_80 = lVar3 * (lVar5 * (longdouble)-4.0 * local_44 +
                         lVar4 * lVar5 * lVar5 *
                         (lVar6 * lVar6 + (longdouble)-3.0 * lVar6 + (longdouble)3.0) +
                         lVar5 * lVar5 * (longdouble)6.0 * local_70) + local_80;
      local_44 = ((longdouble)-3.0 * lVar5 * local_70 + (lVar6 + (longdouble)-2.0) * lVar4 * lVar5)
                 * lVar3 + local_44;
      local_70 = lVar4 * lVar3 + local_70;
      lVar4 = lVar6;
    }
    lVar2 = lVar6;
  }
  if ((longdouble)0 < lVar4) {
    lVar4 = (lVar4 / local_70) * (local_80 / local_70);
    uStack_50 = (ushort)((unkuint10)lVar4 >> 0x40);
    local_58 = SUB108(lVar4,0);
    if (((unkuint10)lVar4 & 0x7fff) == 0 ||
        (ushort)((uStack_50 & 0x7fff) - 1) < 0x7ffe && local_58 < 0) {
      if (0.0 < (double)lVar4) {
        return (double)lVar4;
      }
      return 0.0;
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(real_t *restrict x, size_t n_, MissingAction missing_action, real_t *restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = 0; row < n_; row++)
    {
        if (likely(!is_na_or_inf(x[row])))
        {
            w_this = w[row];
            n += w_this;

            delta      =  x[row] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}